

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O2

int is_igp(int chipset)

{
  if ((((0x1c < chipset - 0x4cU) || ((0x18800005U >> (chipset - 0x4cU & 0x1f) & 1) == 0)) &&
      ((0x2a < (uint)chipset || ((0x40084000400U >> ((ulong)(uint)chipset & 0x3f) & 1) == 0)))) &&
     ((5 < chipset - 0xaaU || ((0x25U >> (chipset - 0xaaU & 0x1f) & 1) == 0)))) {
    return 0;
  }
  return 1;
}

Assistant:

int is_igp(int chipset) {
	switch (chipset) {
		case 0x0a:
		case 0x1a:
		case 0x1f:
		case 0x2a:
		case 0x4e:
		case 0x4c:
		case 0x67:
		case 0x68:
		case 0x63:
		case 0xaa:
		case 0xac:
		case 0xaf:
			return 1;
		default:
			return 0;
	}
}